

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AeronArchive.cpp
# Opt level: O0

void __thiscall
aeron::archive::AeronArchive::awaitConnection(AeronArchive *this,TimePoint *deadline)

{
  bool bVar1;
  int32_t __val;
  element_type *peVar2;
  ArchiveException *this_00;
  string *__rhs;
  char *pcVar3;
  element_type *this_01;
  AgentInvoker<aeron::ClientConductor> *this_02;
  allocator local_129;
  string local_128;
  allocator local_101;
  string local_100;
  undefined1 local_e0 [48];
  undefined1 local_b0 [48];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_40 [3];
  undefined1 local_28 [24];
  TimePoint *deadline_local;
  AeronArchive *this_local;
  
  local_28._16_8_ = deadline;
  deadline_local = (TimePoint *)this;
  while( true ) {
    std::
    unique_ptr<aeron::archive::ControlResponsePoller,_std::default_delete<aeron::archive::ControlResponsePoller>_>
    ::operator->(&this->controlResponsePoller_);
    ControlResponsePoller::subscription((ControlResponsePoller *)local_28);
    peVar2 = std::__shared_ptr_access<aeron::Subscription,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<aeron::Subscription,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_28);
    bVar1 = Subscription::isConnected(peVar2);
    std::shared_ptr<aeron::Subscription>::~shared_ptr((shared_ptr<aeron::Subscription> *)local_28);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      return;
    }
    local_40[0].__d.__r = (duration)std::chrono::_V2::system_clock::now();
    bVar1 = std::chrono::operator>
                      (local_40,(time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                                 *)local_28._16_8_);
    if (bVar1) break;
    concurrent::YieldingIdleStrategy::idle((YieldingIdleStrategy *)&this->field_0x138);
    this_01 = std::__shared_ptr_access<aeron::Aeron,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<aeron::Aeron,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)&this->aeron_);
    this_02 = Aeron::conductorAgentInvoker(this_01);
    concurrent::AgentInvoker<aeron::ClientConductor>::invoke(this_02);
  }
  this_00 = (ArchiveException *)__cxa_allocate_exception(0x48);
  std::
  unique_ptr<aeron::archive::ControlResponsePoller,_std::default_delete<aeron::archive::ControlResponsePoller>_>
  ::operator->(&this->controlResponsePoller_);
  ControlResponsePoller::subscription((ControlResponsePoller *)local_b0);
  peVar2 = std::__shared_ptr_access<aeron::Subscription,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<aeron::Subscription,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_b0);
  __rhs = Subscription::channel_abi_cxx11_(peVar2);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (local_b0 + 0x10),"failed to establish response connection on ",__rhs);
  std::operator+(&local_80,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (local_b0 + 0x10),", stream id: ");
  std::
  unique_ptr<aeron::archive::ControlResponsePoller,_std::default_delete<aeron::archive::ControlResponsePoller>_>
  ::operator->(&this->controlResponsePoller_);
  ControlResponsePoller::subscription((ControlResponsePoller *)local_e0);
  peVar2 = std::__shared_ptr_access<aeron::Subscription,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<aeron::Subscription,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_e0);
  __val = Subscription::streamId(peVar2);
  std::__cxx11::to_string((string *)(local_e0 + 0x10),__val);
  std::operator+(&local_60,&local_80,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (local_e0 + 0x10));
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_100,
             "void aeron::archive::AeronArchive::awaitConnection(const TimePoint &)",&local_101);
  pcVar3 = aeron::util::past_prefix
                     ("/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client/src/AeronArchive.cpp"
                     );
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_128,pcVar3,&local_129);
  ArchiveException::ArchiveException(this_00,&local_60,&local_100,&local_128,0x157);
  __cxa_throw(this_00,&ArchiveException::typeinfo,ArchiveException::~ArchiveException);
}

Assistant:

void AeronArchive::awaitConnection(const TimePoint& deadline) {
    while (!controlResponsePoller_->subscription()->isConnected()) {
        if (Clock::now() > deadline) {
            throw ArchiveException(
                "failed to establish response connection on " + controlResponsePoller_->subscription()->channel() +
                    ", stream id: " + std::to_string(controlResponsePoller_->subscription()->streamId()),
                SOURCEINFO);
        }

        idleStrategy_.idle();
        aeron_->conductorAgentInvoker().invoke();
    }
}